

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Invoke(VirtualMachine *this)

{
  undefined4 uVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  Variable VVar7;
  size_type local_a8;
  size_t i_1;
  size_t stackFrameLocalIndex;
  Variable top;
  pointer local_70;
  size_t i;
  string local_60;
  undefined1 local_30 [8];
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> args;
  size_t argCount;
  VirtualMachine *this_local;
  
  args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)getByteCodeParameter(this);
  std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::vector
            ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30);
  std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::reserve
            ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30,
             (size_type)
             args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"No stack frame found in Invoke",
               (allocator<char> *)((long)&i + 7));
    panic(this,&local_60);
  }
  for (local_70 = (pointer)0x0;
      local_70 <
      args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; local_70 = (pointer)((long)&local_70->type + 1)) {
    VVar7 = popOpStack(this);
    top.field_1.integerValue._0_4_ = VVar7.type;
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::push_back
              ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30,
               (value_type *)&top.field_1);
  }
  VVar7 = popOpStack(this);
  top._0_8_ = VVar7.field_1;
  if (VVar7.type == Function) {
    pushStackFrame(this,(Function *)top._0_8_);
    i_1 = 0;
    local_a8 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                         ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30)
    ;
    while( true ) {
      bVar2 = false;
      if (local_a8 != 0) {
        peVar3 = std::
                 __shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->stackFrame);
        sVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                          (&peVar3->locals);
        bVar2 = i_1 < sVar4;
      }
      if (!bVar2) break;
      pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30,
                          local_a8 - 1);
      peVar3 = std::
               __shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->stackFrame);
      pvVar6 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         (&peVar3->locals,i_1);
      uVar1 = *(undefined4 *)&pvVar5->field_0x4;
      pvVar6->type = pvVar5->type;
      *(undefined4 *)&pvVar6->field_0x4 = uVar1;
      pvVar6->field_1 = pvVar5->field_1;
      i_1 = i_1 + 1;
      local_a8 = local_a8 - 1;
    }
  }
  else {
    pushUndefined(this);
    advance(this);
  }
  std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::~vector
            ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)local_30);
  return;
}

Assistant:

void runtime::VirtualMachine::Invoke() {

  std::size_t argCount = this->getByteCodeParameter();

  std::vector<runtime::Variable> args;
  args.reserve(argCount);

  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in Invoke");
    return;
  }

  // index 0 <- arg n
  // index 1 <- arg n - 1
  // index n - 1 <- arg 1
  // index n <- arg 0

  for (std::size_t i = 0; i < argCount; i++) {
    args.push_back(this->popOpStack());
  }

  Variable top = this->popOpStack();

  if (top.type != VariableType::Function) {
    this->pushUndefined();
    this->advance();
    return;
  }

  this->pushStackFrame(top.functionValue);

  for (
    std::size_t stackFrameLocalIndex = 0, i = args.size();
    i-- > 0 && stackFrameLocalIndex < this->stackFrame->locals.size();
    stackFrameLocalIndex++
  ) {
    this->stackFrame->locals.at(stackFrameLocalIndex) = args.at(i);
  }
}